

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  string *psVar1;
  long lVar2;
  FileDescriptor *pFVar3;
  undefined8 *puVar4;
  MessageGenerator *this_00;
  Descriptor *pDVar5;
  Descriptor *in_RDX;
  FieldDescriptor *field;
  long lVar6;
  long lVar7;
  string local_a0;
  string local_80;
  MessageGenerator *local_60;
  string *local_58;
  string superclass;
  
  SuperClassName_abi_cxx11_(&superclass,(cxx *)this->descriptor_,in_RDX);
  psVar1 = &this->classname_;
  io::Printer::Print(printer,
                     "$classname$::$classname$()\n  : $superclass$() {\n  SharedCtor();\n}\n",
                     "classname",psVar1,"superclass",&superclass);
  io::Printer::Print(printer,"\nvoid $classname$::InitAsDefaultInstance() {\n","classname",psVar1);
  pDVar5 = this->descriptor_;
  local_60 = this;
  local_58 = psVar1;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar2 = *(long *)(pDVar5 + 0x30);
      if ((*(int *)(lVar2 + 0x30 + lVar7) != 3) &&
         (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar2 + 0x2c + lVar7) * 4)
          == 10)) {
        pFVar3 = *(FileDescriptor **)(pDVar5 + 0x10);
        FieldName_abi_cxx11_
                  (&local_a0,(cxx *)(lVar2 + lVar7),
                   (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
        FieldMessageTypeName_abi_cxx11_(&local_80,(cxx *)(lVar2 + lVar7),field);
        PrintHandlingOptionalStaticInitializers
                  (pFVar3,printer,"  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n"
                   ,
                   "  $name$_ = const_cast< $type$*>(\n      $type$::internal_default_instance());\n"
                   ,"name",&local_a0,"type",&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        pDVar5 = local_60->descriptor_;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar6 < *(int *)(pDVar5 + 0x2c));
  }
  io::Printer::Print(printer,"}\n\n");
  psVar1 = local_58;
  this_00 = local_60;
  io::Printer::Print(printer,
                     "$classname$::$classname$(const $classname$& from)\n  : $superclass$() {\n  SharedCtor();\n  MergeFrom(from);\n}\n\n"
                     ,"classname",local_58,"superclass",&superclass);
  GenerateSharedConstructorCode(this_00,printer);
  io::Printer::Print(printer,"$classname$::~$classname$() {\n  SharedDtor();\n}\n\n","classname",
                     psVar1);
  GenerateSharedDestructorCode(this_00,printer);
  io::Printer::Print(printer,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",psVar1);
  puVar4 = *(undefined8 **)(this_00->descriptor_ + 0x10);
  if ((*(int *)(puVar4[0x11] + 0x50) != 3) &&
     (*(char *)(*(long *)(this_00->descriptor_ + 0x20) + 0x59) == '\0')) {
    GlobalAddDescriptorsName(&local_a0,(string *)*puVar4);
    io::Printer::Print(printer,
                       "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\n"
                       ,"classname",psVar1,"adddescriptorsname",&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Print(printer,"const $classname$& $classname$::default_instance() {\n","classname",
                     psVar1);
  pFVar3 = *(FileDescriptor **)(this_00->descriptor_ + 0x10);
  GlobalAddDescriptorsName(&local_a0,*(string **)pFVar3);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  PrintHandlingOptionalStaticInitializers
            (pFVar3,printer,"  if (default_instance_ == NULL) $adddescriptorsname$();\n",
             "  $adddescriptorsname$();\n","adddescriptorsname",&local_a0,(char *)0x0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  GlobalAddDescriptorsName(&local_a0,(string *)**(undefined8 **)(this_00->descriptor_ + 0x10));
  io::Printer::Print(printer,
                     "  return *default_instance_;\n}\n\n$classname$* $classname$::default_instance_ = NULL;\n\n$classname$* $classname$::New() const {\n  return new $classname$;\n}\n"
                     ,"classname",psVar1,"adddescriptorsname",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)superclass._M_dataplus._M_p != &superclass.field_2) {
    operator_delete(superclass._M_dataplus._M_p,superclass.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass = SuperClassName(descriptor_);

  // Generate the default constructor.
  printer->Print(
    "$classname$::$classname$()\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "}\n",
    "classname", classname_,
    "superclass", superclass);

  printer->Print(
    "\n"
    "void $classname$::InitAsDefaultInstance() {\n",
    "classname", classname_);

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n",
        // Without.
        "  $name$_ = const_cast< $type$*>(\n"
        "      $type$::internal_default_instance());\n",
        // Vars.
        "name", FieldName(field),
        "type", FieldMessageTypeName(field));
    }
  }
  printer->Print(
    "}\n"
    "\n");

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "  MergeFrom(from);\n"
    "}\n"
    "\n",
    "classname", classname_,
    "superclass", superclass);

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_);

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  return $classname$_descriptor_;\n"
      "}\n"
      "\n",
      "classname", classname_,
      "adddescriptorsname",
      GlobalAddDescriptorsName(descriptor_->file()->name()));
  }

  printer->Print(
    "const $classname$& $classname$::default_instance() {\n",
    "classname", classname_);

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "  if (default_instance_ == NULL) $adddescriptorsname$();\n",
    // Without.
    "  $adddescriptorsname$();\n",
    // Vars.
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "  return *default_instance_;\n"
    "}\n"
    "\n"
    "$classname$* $classname$::default_instance_ = NULL;\n"
    "\n"
    "$classname$* $classname$::New() const {\n"
    "  return new $classname$;\n"
    "}\n",
    "classname", classname_,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));
}